

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_FontMetrics::HeightsAreValid(ON_FontMetrics *this)

{
  bool bVar1;
  ON_FontMetrics *this_local;
  
  bVar1 = AscentDescentAndUPMAreValid(this);
  if (bVar1) {
    if (this->m_line_space < this->m_ascent - this->m_descent) {
      this_local._7_1_ = false;
    }
    else if (this->m_ascent < (int)(uint)this->m_ascent_of_capital) {
      this_local._7_1_ = false;
    }
    else if (this->m_ascent < (int)(uint)this->m_ascent_of_x) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_FontMetrics::HeightsAreValid() const
{
  // basic validation
  if (false == AscentDescentAndUPMAreValid() )
    return false;

  // sanity check
  if (m_line_space < m_ascent - m_descent)
    return false;
  if (((int)m_ascent_of_capital) > m_ascent)
    return false;
  if (((int)m_ascent_of_x) > m_ascent)
    return false;

  return true;
}